

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare::operator()
          (SymbolCompare *this,StringPiece *lhs,SymbolEntry *rhs)

{
  char *__s1;
  ulong uVar1;
  bool bVar2;
  _Alloc_hider __s2;
  size_type sVar3;
  uint uVar4;
  int iVar5;
  size_type __n;
  ulong __n_00;
  byte bVar6;
  StringPiece *this_00;
  StringPiece x;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  rhs_parts;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  lhs_parts;
  string local_90;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  local_70;
  StringPiece local_50;
  void *local_40;
  ulong uStack_38;
  
  local_50.ptr_ = lhs->ptr_;
  local_50.length_ = lhs->length_;
  local_40 = (void *)0x0;
  uStack_38 = 0;
  GetParts(&local_70,this,rhs);
  local_90._0_16_ = stringpiece_internal::StringPiece::substr(&local_50,0,local_70.first.length_);
  this_00 = (StringPiece *)&local_90;
  x = stringpiece_internal::StringPiece::substr(&local_70.first,0,local_50.length_);
  uVar4 = stringpiece_internal::StringPiece::compare(this_00,x);
  uVar1 = uStack_38;
  if (uVar4 == 0) {
    if (local_50.length_ != local_70.first.length_) {
      bVar2 = true;
      goto LAB_00390207;
    }
    __n_00 = local_70.second.length_;
    if (uStack_38 < local_70.second.length_) {
      __n_00 = uStack_38;
    }
    iVar5 = memcmp(local_40,local_70.second.ptr_,__n_00);
    if (iVar5 < 0) {
      this_00 = (StringPiece *)0x1;
    }
    else {
      this_00 = (StringPiece *)(ulong)(iVar5 == 0 && uVar1 < local_70.second.length_);
    }
  }
  else {
    this_00 = (StringPiece *)(ulong)(uVar4 >> 0x1f);
  }
  bVar2 = false;
LAB_00390207:
  bVar6 = (byte)this_00;
  if (bVar2) {
    __s1 = lhs->ptr_;
    uVar1 = lhs->length_;
    SymbolEntry::AsString_abi_cxx11_(&local_90,rhs,this->index);
    __s2._M_p = local_90._M_dataplus._M_p;
    sVar3 = local_90._M_string_length;
    if ((long)local_90._M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (local_90._M_string_length,"string length exceeds max size");
    }
    __n = sVar3;
    if (uVar1 < sVar3) {
      __n = uVar1;
    }
    iVar5 = memcmp(__s1,__s2._M_p,__n);
    bVar6 = iVar5 < 0 || iVar5 == 0 && uVar1 < sVar3;
    if ((StringPiece *)local_90._M_dataplus._M_p != (StringPiece *)&local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool operator()(const T& lhs, const U& rhs) const {
      auto lhs_parts = GetParts(lhs);
      auto rhs_parts = GetParts(rhs);

      // Fast path to avoid making the whole string for common cases.
      if (int res =
              lhs_parts.first.substr(0, rhs_parts.first.size())
                  .compare(rhs_parts.first.substr(0, lhs_parts.first.size()))) {
        // If the packages already differ, exit early.
        return res < 0;
      } else if (lhs_parts.first.size() == rhs_parts.first.size()) {
        return lhs_parts.second < rhs_parts.second;
      }
      return AsString(lhs) < AsString(rhs);
    }